

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

char * Bac_ObjNameStr(Bac_Ntk_t *p,int i)

{
  Bac_NameType_t BVar1;
  int i_00;
  char *pcVar2;
  int i_local;
  Bac_Ntk_t *p_local;
  
  BVar1 = Bac_ObjNameType(p,i);
  if (BVar1 < BAC_NAME_INFO) {
    i_00 = Bac_ObjNameId(p,i);
    pcVar2 = Bac_NtkStr(p,i_00);
    return pcVar2;
  }
  __assert_fail("Bac_ObjNameType(p, i) <= BAC_NAME_WORD",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                ,0x123,"char *Bac_ObjNameStr(Bac_Ntk_t *, int)");
}

Assistant:

static inline char *         Bac_ObjNameStr( Bac_Ntk_t * p, int i )          { assert(Bac_ObjNameType(p, i) <= BAC_NAME_WORD); return Bac_NtkStr(p, Bac_ObjNameId(p, i));  }